

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_SetJoin.cpp
# Opt level: O2

void __thiscall
SetJoinGameCommand::trigger
          (SetJoinGameCommand *this,Server *source,PlayerInfo *player,string_view parameters)

{
  size_type sVar1;
  pointer pcVar2;
  Config *pCVar3;
  string_view parameters_local;
  string local_70;
  string local_50 [32];
  
  pCVar3 = pluginInstance.setjoin_file;
  parameters_local._M_str = parameters._M_str;
  parameters_local._M_len = parameters._M_len;
  sVar1 = (player->uuid)._M_string_length;
  if (sVar1 == 0) {
    RenX::Server::sendMessage(source,player,0x28,"Error: A setjoin message requires steam.");
    return;
  }
  if (parameters_local._M_len != 0) {
    pcVar2 = (player->uuid)._M_dataplus._M_p;
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (local_50,&parameters_local,(allocator<char> *)&local_70);
    Jupiter::Config::set(pCVar3,sVar1,pcVar2,local_50);
    std::__cxx11::string::~string(local_50);
    Jupiter::Config::write();
    string_printf_abi_cxx11_
              (&local_70,"%.*s, your join message is now: %.*s",(player->name)._M_string_length,
               (player->name)._M_dataplus._M_p,parameters_local._M_len,parameters_local._M_str);
    RenX::Server::sendMessage(source,player,local_70._M_string_length,local_70._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_70);
    return;
  }
  DelJoinGameCommand::trigger((DelJoinGameCommand *)this,source,player,parameters);
  return;
}

Assistant:

void SetJoinGameCommand::trigger(RenX::Server *source, RenX::PlayerInfo *player, std::string_view parameters) {
	if (!player->uuid.empty()) {
		if (!parameters.empty()) {
			pluginInstance.setjoin_file.set(player->uuid, static_cast<std::string>(parameters));
			pluginInstance.setjoin_file.write();
			source->sendMessage(*player, string_printf("%.*s, your join message is now: %.*s", player->name.size(), player->name.data(), parameters.size(),
				parameters.data()));
		}
		else DelJoinGameCommand_instance.trigger(source, player, parameters);
	}
	else source->sendMessage(*player, "Error: A setjoin message requires steam."sv);
}